

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtUtil.c
# Opt level: O3

Rwt_Node_t *
Rwt_ManAddNode(Rwt_Man_t *p,Rwt_Node_t *p0,Rwt_Node_t *p1,int fExor,int Level,int Volume)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Rwt_Node_t *pRVar3;
  Rwt_Node_t **ppRVar4;
  uint uVar5;
  Rwt_Node_t *pRVar6;
  void **ppvVar7;
  uint uVar8;
  Rwt_Node_t **ppRVar9;
  uint uVar10;
  
  p->nConsidered = p->nConsidered + 1;
  if (fExor == 0) {
    if (((ulong)p0 & 1) == 0) {
      uVar5 = *(uint *)&p0->field_0x8;
    }
    else {
      uVar5 = ~*(uint *)(((ulong)p0 & 0xfffffffffffffffe) + 8);
    }
    if (((ulong)p1 & 1) == 0) {
      uVar8 = *(uint *)&p1->field_0x8;
    }
    else {
      uVar8 = ~*(uint *)(((ulong)p1 & 0xfffffffffffffffe) + 8);
    }
    uVar8 = uVar8 & uVar5;
  }
  else {
    uVar8 = *(uint *)&p1->field_0x8 ^ *(uint *)&p0->field_0x8;
  }
  uVar10 = uVar8 & 0xffff;
  pRVar6 = (Rwt_Node_t *)Mem_FixedEntryFetch(p->pMmNode);
  pRVar6->Id = p->vForest->nSize;
  pRVar6->TravId = 0;
  *(uint *)&pRVar6->field_0x8 =
       fExor << 0x1f | (Volume & 0xffU) << 0x10 | (Level & 0x3fU) << 0x18 | uVar10;
  pRVar6->p0 = p0;
  pRVar6->p1 = p1;
  pRVar6->pNext = (Rwt_Node_t *)0x0;
  pVVar2 = p->vForest;
  uVar5 = pVVar2->nSize;
  if (uVar5 == pVVar2->nCap) {
    if ((int)uVar5 < 0x10) {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc(0x80);
      }
      else {
        ppvVar7 = (void **)realloc(pVVar2->pArray,0x80);
      }
      pVVar2->pArray = ppvVar7;
      pVVar2->nCap = 0x10;
    }
    else {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
      }
      else {
        ppvVar7 = (void **)realloc(pVVar2->pArray,(ulong)uVar5 << 4);
      }
      pVVar2->pArray = ppvVar7;
      pVVar2->nCap = uVar5 * 2;
    }
  }
  else {
    ppvVar7 = pVVar2->pArray;
  }
  iVar1 = pVVar2->nSize;
  pVVar2->nSize = iVar1 + 1;
  ppvVar7[iVar1] = pRVar6;
  if (p->puCanons[uVar10] == (unsigned_short)uVar8) {
    p->nAdded = p->nAdded + 1;
    if (p->pTable[uVar10] == (Rwt_Node_t *)0x0) {
      p->nClasses = p->nClasses + 1;
    }
    ppRVar4 = p->pTable + uVar10;
    do {
      ppRVar9 = ppRVar4;
      pRVar3 = *ppRVar9;
      ppRVar4 = &pRVar3->pNext;
    } while (pRVar3 != (Rwt_Node_t *)0x0);
    *ppRVar9 = pRVar6;
  }
  return pRVar6;
}

Assistant:

Rwt_Node_t * Rwt_ManAddNode( Rwt_Man_t * p, Rwt_Node_t * p0, Rwt_Node_t * p1, int fExor, int Level, int Volume )
{
    Rwt_Node_t * pNew;
    unsigned uTruth;
    // compute truth table, leve, volume
    p->nConsidered++;
    if ( fExor )
        uTruth = (p0->uTruth ^ p1->uTruth);
    else
        uTruth = (Rwt_IsComplement(p0)? ~Rwt_Regular(p0)->uTruth : Rwt_Regular(p0)->uTruth) &
                 (Rwt_IsComplement(p1)? ~Rwt_Regular(p1)->uTruth : Rwt_Regular(p1)->uTruth) & 0xFFFF;
    // create the new node
    pNew = (Rwt_Node_t *)Mem_FixedEntryFetch( p->pMmNode );
    pNew->Id     = p->vForest->nSize;
    pNew->TravId = 0;
    pNew->uTruth = uTruth;
    pNew->Level  = Level;
    pNew->Volume = Volume;
    pNew->fUsed  = 0;
    pNew->fExor  = fExor;
    pNew->p0     = p0;
    pNew->p1     = p1;
    pNew->pNext  = NULL;
    Vec_PtrPush( p->vForest, pNew );
    // do not add if the node is not essential
    if ( uTruth != p->puCanons[uTruth] )
        return pNew;

    // add to the list
    p->nAdded++;
    if ( p->pTable[uTruth] == NULL )
        p->nClasses++;
    Rwt_ListAddToTail( p->pTable + uTruth, pNew );
    return pNew;
}